

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ext(TCGContext_conflict2 *tcg_ctx,TCGv_i32 res,TCGv_i32 val,int opsize,int sign)

{
  if (opsize == 2) {
    if (res != val) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(res + (long)tcg_ctx),
                       (TCGArg)(val + (long)tcg_ctx));
      return;
    }
    return;
  }
  if (opsize == 1) {
    if (sign == 0) {
      tcg_gen_ext16u_i32_m68k(tcg_ctx,res,val);
      return;
    }
    tcg_gen_ext16s_i32_m68k(tcg_ctx,res,val);
    return;
  }
  if (opsize != 0) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
               ,0x24c,(char *)0x0);
  }
  if (sign == 0) {
    tcg_gen_ext8u_i32_m68k(tcg_ctx,res,val);
    return;
  }
  tcg_gen_ext8s_i32_m68k(tcg_ctx,res,val);
  return;
}

Assistant:

static inline void gen_ext(TCGContext *tcg_ctx, TCGv res, TCGv val, int opsize, int sign)
{
    switch (opsize) {
    case OS_BYTE:
        if (sign) {
            tcg_gen_ext8s_i32(tcg_ctx, res, val);
        } else {
            tcg_gen_ext8u_i32(tcg_ctx, res, val);
        }
        break;
    case OS_WORD:
        if (sign) {
            tcg_gen_ext16s_i32(tcg_ctx, res, val);
        } else {
            tcg_gen_ext16u_i32(tcg_ctx, res, val);
        }
        break;
    case OS_LONG:
        tcg_gen_mov_i32(tcg_ctx, res, val);
        break;
    default:
        g_assert_not_reached();
    }
}